

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O3

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  _Elt_pointer pCVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  data_type *pdVar3;
  undefined4 in_register_00000034;
  string *str;
  
  str = (string *)CONCAT44(in_register_00000034,__fd);
  pvVar1 = (void *)this->bytesRemaining_;
  if (__buf <= pvVar1) {
    pCVar2 = (this->iter_)._M_cur;
    pdVar3 = pCVar2->readPos_ + this->chunkPos_;
    if (pCVar2->writePos_ + -(long)pdVar3 < __buf) {
      slowStringRead(this,str,(size_type)__buf);
      in_RAX = extraout_RAX;
    }
    else {
      std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,(ulong)pdVar3);
      incrementChunk(this,(size_type)__buf);
      in_RAX = extraout_RAX_00;
    }
  }
  return CONCAT71((int7)((ulong)in_RAX >> 8),__buf <= pvVar1);
}

Assistant:

bool read(std::string &str, size_type size) { 
        if(size > bytesRemaining_) {
            return false;
        }

        if(size <= chunkRemaining()) {
            fastStringRead(str, size);
        }
        else {
            slowStringRead(str, size);
        }

        return true;
    }